

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pca.hpp
# Opt level: O0

void __thiscall PCA::pca_model::pca_model(pca_model *this,ggml_tensor *t_input)

{
  double dVar1;
  long lVar2;
  undefined8 uVar3;
  size_type sVar4;
  reference pvVar5;
  float *pfVar6;
  undefined8 uVar7;
  long in_RSI;
  long *in_RDI;
  result_type_conflict rVar8;
  size_t i_1;
  float random_vec_norm;
  float f;
  size_t i;
  float sum_sqr;
  uniform_real_distribution<float> distribution;
  default_random_engine generator;
  vector<float,_std::allocator<float>_> random_vec;
  int64_t n_embd;
  int64_t n_samples;
  ggml_init_params params;
  int num_tensors;
  float __b;
  float __a;
  undefined4 uVar9;
  undefined4 uVar10;
  allocator_type *__a_00;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffed0;
  size_type in_stack_fffffffffffffed8;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffee0;
  ulong local_b8;
  ulong local_a8;
  float local_9c;
  vector<float,_std::allocator<float>_> local_70;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  allocator_type *local_38;
  long local_30;
  undefined8 uStack_28;
  undefined1 local_20;
  undefined7 uStack_1f;
  undefined4 local_14;
  long local_10;
  
  *in_RDI = 0;
  local_10 = in_RSI;
  if (*in_RDI == 0) {
    lVar2 = ggml_backend_cpu_init();
    *in_RDI = lVar2;
  }
  local_14 = 4;
  local_30 = ggml_tensor_overhead();
  local_30 = local_30 << 2;
  uStack_28 = 0;
  local_20 = 1;
  __a_00 = (allocator_type *)CONCAT71(uStack_1f,1);
  uStack_40 = 0;
  local_48._0_4_ = (float)local_30;
  local_48._4_4_ = (float)((ulong)local_30 >> 0x20);
  uStack_40._0_4_ = 0;
  uStack_40._4_4_ = 0;
  __b = (float)local_48;
  __a = local_48._4_4_;
  uVar9 = (undefined4)uStack_40;
  uVar10 = uStack_40._4_4_;
  local_48 = local_30;
  local_38 = __a_00;
  lVar2 = ggml_init();
  in_RDI[2] = lVar2;
  local_50 = *(undefined8 *)(local_10 + 0x10);
  local_58 = *(undefined8 *)(local_10 + 0x18);
  lVar2 = ggml_new_tensor_2d(in_RDI[2],0,local_50,local_58);
  in_RDI[4] = lVar2;
  lVar2 = ggml_new_tensor_2d(in_RDI[2],0,local_58);
  in_RDI[5] = lVar2;
  lVar2 = ggml_new_tensor_1d(in_RDI[2],0,local_58);
  in_RDI[6] = lVar2;
  ggml_set_name(in_RDI[4],"dev_input");
  ggml_set_name(in_RDI[5],"dev_square");
  ggml_set_name(in_RDI[6],"dev_eigenvector");
  lVar2 = ggml_backend_alloc_ctx_tensors(in_RDI[2],*in_RDI);
  in_RDI[1] = lVar2;
  lVar2 = in_RDI[4];
  uVar7 = *(undefined8 *)(local_10 + 0xf8);
  uVar3 = ggml_nbytes();
  ggml_backend_tensor_set(lVar2,uVar7,0,uVar3);
  ggml_nelements(in_RDI[6]);
  std::allocator<float>::allocator((allocator<float> *)0x188f19);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
             (value_type_conflict3 *)in_stack_fffffffffffffed0,__a_00);
  std::allocator<float>::~allocator((allocator<float> *)0x188f4a);
  time((time_t *)0x0);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             CONCAT44(uVar10,uVar9),CONCAT44(__a,__b));
  std::uniform_real_distribution<float>::uniform_real_distribution
            ((uniform_real_distribution<float> *)CONCAT44(uVar10,uVar9),__a,__b);
  local_9c = 0.0;
  local_a8 = 0;
  while( true ) {
    sVar4 = std::vector<float,_std::allocator<float>_>::size(&local_70);
    if (sVar4 <= local_a8) break;
    rVar8 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)CONCAT44(uVar10,uVar9),
                       (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                       CONCAT44(__a,__b));
    local_9c = rVar8 * rVar8 + local_9c;
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](&local_70,local_a8);
    *pvVar5 = rVar8;
    local_a8 = local_a8 + 1;
  }
  dVar1 = std::sqrt((double)(ulong)(uint)local_9c);
  local_b8 = 0;
  while( true ) {
    sVar4 = std::vector<float,_std::allocator<float>_>::size(&local_70);
    if (sVar4 <= local_b8) break;
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](&local_70,local_b8);
    *pvVar5 = *pvVar5 / SUB84(dVar1,0);
    local_b8 = local_b8 + 1;
  }
  lVar2 = in_RDI[6];
  pfVar6 = std::vector<float,_std::allocator<float>_>::data
                     ((vector<float,_std::allocator<float>_> *)0x189170);
  uVar7 = ggml_nbytes(in_RDI[6]);
  ggml_backend_tensor_set(lVar2,pfVar6,0,uVar7);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffed0);
  return;
}

Assistant:

pca_model(struct ggml_tensor * t_input) {
#ifdef GGML_USE_CUDA
        fprintf(stderr, "%s: using CUDA backend\n", __func__);
        backend = ggml_backend_cuda_init(0); // init device 0
        if (!backend) {
            fprintf(stderr, "%s: ggml_backend_cuda_init() failed\n", __func__);
        }
#endif

// TODO: enable Metal support when support for GGML_OP_SQRT is added
// #ifdef GGML_USE_METAL
//         fprintf(stderr, "%s: using Metal backend\n", __func__);
//         backend = ggml_backend_metal_init();
//         if (!backend) {
//             fprintf(stderr, "%s: ggml_backend_metal_init() failed\n", __func__);
//         }
// #endif

        // if there aren't GPU Backends fallback to CPU backend
        if (!backend) {
            backend = ggml_backend_cpu_init();
        }

        const int num_tensors = 4;
        struct ggml_init_params params {
            /*.mem_size   =*/ ggml_tensor_overhead() * num_tensors,
            /*.mem_buffer =*/ NULL,
            /*.no_alloc   =*/ true,
        };
        ctx = ggml_init(params);

        auto n_samples = t_input->ne[0];
        auto n_embd    = t_input->ne[1];

        dev_input       = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, n_samples, n_embd);
        dev_square      = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, n_embd,    n_embd);
        dev_eigenvector = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);

        ggml_set_name(dev_input,       "dev_input");
        ggml_set_name(dev_square,      "dev_square");
        ggml_set_name(dev_eigenvector, "dev_eigenvector");
        buffer = ggml_backend_alloc_ctx_tensors(ctx, backend);
        ggml_backend_tensor_set(dev_input, t_input->data, 0, ggml_nbytes(t_input));

        // initialize eigenvector to random normalized vector
        {
            std::vector<float> random_vec(ggml_nelements(dev_eigenvector), 0.0);
            std::default_random_engine generator(static_cast<unsigned int>(std::time(0)));
            std::uniform_real_distribution<float> distribution(0.0, 1.0);
            float sum_sqr = 0.0; // for normalizing random_vec
            for (size_t i = 0; i < random_vec.size(); ++i) {
                float f = distribution(generator);
                sum_sqr += f * f;
                random_vec[i] = f;
            }
            // normalize it
            float random_vec_norm = std::sqrt(sum_sqr);
            for (size_t i = 0; i < random_vec.size(); ++i) {
                random_vec[i] /= random_vec_norm;
            }
            ggml_backend_tensor_set(dev_eigenvector, random_vec.data(), 0, ggml_nbytes(dev_eigenvector));
        }
    }